

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int source_get_filter(SOURCE_HANDLE source,filter_set *filter_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  SOURCE_INSTANCE *source_instance;
  uint32_t item_count;
  int result;
  filter_set *filter_value_local;
  SOURCE_HANDLE source_local;
  
  if (source == (SOURCE_HANDLE)0x0) {
    source_instance._4_4_ = 13000;
  }
  else {
    _item_count = filter_value;
    filter_value_local = &source->composite_value;
    iVar1 = amqpvalue_get_composite_item_count(source->composite_value,(uint32_t *)&source_instance)
    ;
    if (iVar1 == 0) {
      if ((uint)source_instance < 8) {
        source_instance._4_4_ = 0x32d6;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(source->composite_value,7);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          source_instance._4_4_ = 0x32de;
        }
        else {
          iVar1 = amqpvalue_get_map(value,_item_count);
          if (iVar1 == 0) {
            source_instance._4_4_ = 0;
          }
          else {
            source_instance._4_4_ = 0x32e5;
          }
        }
      }
    }
    else {
      source_instance._4_4_ = 0x32d0;
    }
  }
  return source_instance._4_4_;
}

Assistant:

int source_get_filter(SOURCE_HANDLE source, filter_set* filter_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        if (amqpvalue_get_composite_item_count(source_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 7)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(source_instance->composite_value, 7);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_filter_set(item_value, filter_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}